

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdparser.hpp
# Opt level: O0

bool __thiscall cli::Parser::get<bool>(Parser *this,string *name)

{
  _func_int **pp_Var1;
  bool bVar2;
  __type _Var3;
  runtime_error *prVar4;
  long local_e8;
  char local_d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0 [35];
  undefined1 local_8d;
  char local_80 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60 [32];
  long local_40;
  CmdArgument<bool> *cmd;
  CmdBase **command;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_> *__range2;
  string *name_local;
  Parser *this_local;
  
  __end2 = std::vector<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>::begin
                     (&this->_commands);
  command = (CmdBase **)
            std::vector<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>::end
                      (&this->_commands);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<cli::Parser::CmdBase_*const_*,_std::vector<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>_>
                                *)&command);
    if (!bVar2) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(local_d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              "The parameter ");
      std::operator+(local_b0,local_d0);
      std::runtime_error::runtime_error(prVar4,(string *)local_b0);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    cmd = (CmdArgument<bool> *)
          __gnu_cxx::
          __normal_iterator<cli::Parser::CmdBase_*const_*,_std::vector<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>_>
          ::operator*(&__end2);
    _Var3 = std::operator==(&((CmdBase *)(cmd->super_CmdBase)._vptr_CmdBase)->name,name);
    if (_Var3) break;
    __gnu_cxx::
    __normal_iterator<cli::Parser::CmdBase_*const_*,_std::vector<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>_>
    ::operator++(&__end2);
  }
  pp_Var1 = (cmd->super_CmdBase)._vptr_CmdBase;
  if (pp_Var1 == (_func_int **)0x0) {
    local_e8 = 0;
  }
  else {
    local_e8 = __dynamic_cast(pp_Var1,&CmdBase::typeinfo,&CmdArgument<bool>::typeinfo,0);
  }
  local_40 = local_e8;
  if (local_e8 == 0) {
    local_8d = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            "Invalid usage of the parameter ");
    std::operator+(local_60,local_80);
    std::runtime_error::runtime_error(prVar4,(string *)local_60);
    local_8d = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return (bool)(*(byte *)(local_e8 + 0xa8) & 1);
}

Assistant:

T get(const std::string& name) const {
			for (const auto& command : _commands) {
				if (command->name == name) {
					auto cmd = dynamic_cast<CmdArgument<T>*>(command);

					if (cmd == nullptr) {
						throw std::runtime_error("Invalid usage of the parameter " + name + " detected.");
					}

					return cmd->value;
				}
			}

			throw std::runtime_error("The parameter " + name + " could not be found.");
		}